

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cpp
# Opt level: O0

void __thiscall Code_generator::visit(Code_generator *this,Inst_msr *s)

{
  Register *pRVar1;
  allocator local_39;
  string local_38;
  Inst_msr *local_18;
  Inst_msr *s_local;
  Code_generator *this_local;
  
  local_18 = s;
  s_local = (Inst_msr *)this;
  ast::Instruction::check_alignment(&s->super_Instruction);
  if ((local_18->rd->n != 0x12e) && (local_18->rd->n != 0x12f)) {
    pRVar1 = local_18->rd;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_38,"Invalid register",&local_39);
    error_report(&pRVar1->location,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  ast::Sections::write16
            ((local_18->super_Instruction).super_Statement.section_index,
             (local_18->super_Instruction).super_Statement.section_offset,
             (ushort)(local_18->rd->n == 0x12f) << 4 | 0xb040 | (ushort)(local_18->rs->n << 7));
  return;
}

Assistant:

void Code_generator::visit(Inst_msr *s)
{
	s->check_alignment();
	if (s->rd->n != CPSR && s->rd->n != SPSR)
		error_report(&s->rd->location, "Invalid register");
	Sections::write16(s->section_index, s->section_offset,
		static_cast<uint16_t>(MSR_OPCODE 
			| ((s->rd->n == SPSR) << SPSR_INDICATION_POSITION)
			| (s->rs->n << MOV_RS_POSITION)));
}